

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgacl(fitsfile *fptr,int colnum,char *ttype,long *tbcol,char *tunit,char *tform,double *tscal,
          double *tzero,char *tnull,char *tdisp,int *status)

{
  int iVar1;
  char *__src;
  long *in_RCX;
  char *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined1 *in_R8;
  char *in_R9;
  int tstatus;
  tcolumn *colptr;
  char comm [73];
  char name [75];
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  fitsfile *in_stack_ffffffffffffff98;
  int local_4;
  
  if (*(int *)comm._24_8_ < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef((fitsfile *)comm._24_8_,(int *)comm._16_8_), 0 < iVar1)) {
        return *(int *)comm._24_8_;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80);
    }
    if ((in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_ESI)) {
      *(undefined4 *)comm._24_8_ = 0x12e;
      local_4 = 0x12e;
    }
    else {
      __src = (char *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0);
      if (in_RDX != (char *)0x0) {
        strcpy(in_RDX,__src);
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = *(long *)(__src + 0x48) + 1;
      }
      if (in_R9 != (char *)0x0) {
        strcpy(in_R9,__src + 0x8c);
      }
      if (colptr != (tcolumn *)0x0) {
        *(undefined8 *)colptr->ttype = *(undefined8 *)(__src + 0x60);
      }
      if (comm._0_8_ != 0) {
        *(undefined8 *)comm._0_8_ = *(undefined8 *)(__src + 0x68);
      }
      if (comm._8_8_ != 0) {
        strcpy((char *)comm._8_8_,__src + 0x78);
      }
      if (in_R8 != (undefined1 *)0x0) {
        ffkeyn((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48
               ,in_stack_ffffffffffffff40);
        *in_R8 = 0;
        ffgkys(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      if (comm._16_8_ != 0) {
        ffkeyn((char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48
               ,in_stack_ffffffffffffff40);
        *(undefined1 *)comm._16_8_ = 0;
        ffgkys(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      local_4 = *(int *)comm._24_8_;
    }
  }
  else {
    local_4 = *(int *)comm._24_8_;
  }
  return local_4;
}

Assistant:

int ffgacl( fitsfile *fptr,   /* I - FITS file pointer                      */
            int  colnum,      /* I - column number                          */
            char *ttype,      /* O - TTYPEn keyword value                   */
            long *tbcol,      /* O - TBCOLn keyword value                   */
            char *tunit,      /* O - TUNITn keyword value                   */
            char *tform,      /* O - TFORMn keyword value                   */
            double *tscal,    /* O - TSCALn keyword value                   */
            double *tzero,    /* O - TZEROn keyword value                   */
            char *tnull,      /* O - TNULLn keyword value                   */
            char *tdisp,      /* O - TDISPn keyword value                   */
            int  *status)     /* IO - error status                          */
/*
  get ASCII column keyword values
*/
{
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr;
    int tstatus;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    /* get what we can from the column structure */

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum -1);     /* offset to correct column */

    if (ttype)
        strcpy(ttype, colptr->ttype);

    if (tbcol)
        *tbcol = (long) ((colptr->tbcol) + 1);  /* first col is 1, not 0 */

    if (tform)
        strcpy(tform, colptr->tform);

    if (tscal)
        *tscal = colptr->tscale;

    if (tzero)
        *tzero = colptr->tzero;

    if (tnull)
        strcpy(tnull, colptr->strnull);

    /* read keywords to get additional parameters */

    if (tunit)
    {
        ffkeyn("TUNIT", colnum, name, status);
        tstatus = 0;
        *tunit = '\0';
        ffgkys(fptr, name, tunit, comm, &tstatus);
    }

    if (tdisp)
    {
        ffkeyn("TDISP", colnum, name, status);
        tstatus = 0;
        *tdisp = '\0';
        ffgkys(fptr, name, tdisp, comm, &tstatus);
    }

    return(*status);
}